

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O0

void soul::emitMessage(CompileMessage *m)

{
  undefined1 local_108 [8];
  CompileMessageGroup messageGroup;
  CompileMessage *m_local;
  
  messageGroup.messages.space[0x1b] = (uint64_t)m;
  CompileMessageGroup::CompileMessageGroup((CompileMessageGroup *)local_108);
  ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
            ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_108,m);
  emitMessage((CompileMessageGroup *)local_108);
  CompileMessageGroup::~CompileMessageGroup((CompileMessageGroup *)local_108);
  return;
}

Assistant:

void emitMessage (CompileMessage m)
{
    CompileMessageGroup messageGroup;
    messageGroup.messages.push_back (std::move (m));
    emitMessage (messageGroup);
}